

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O2

CURLcode Curl_hsts_save(Curl_easy *data,hsts *h,char *file)

{
  FILE *whereto;
  CURLcode CVar1;
  int iVar2;
  CURLSTScode CVar3;
  Curl_llist_node *pCVar4;
  void *pvVar5;
  char *pcVar6;
  char *tempstore;
  FILE *out;
  char *local_b0;
  hsts *local_a8;
  tm local_a0;
  curl_index i;
  curl_hstsentry e;
  
  tempstore = (char *)0x0;
  if (h == (hsts *)0x0) {
LAB_0012fa18:
    CVar1 = CURLE_OK;
  }
  else {
    if (file == (char *)0x0) {
      file = h->filename;
    }
    CVar1 = CURLE_OK;
    if (((file != (char *)0x0) && ((h->flags & 2) == 0)) && (*file != '\0')) {
      CVar1 = Curl_fopen(data,file,&out,&tempstore);
      if (CVar1 == CURLE_OK) {
        local_b0 = file;
        fputs("# Your HSTS cache. https://curl.se/docs/hsts.html\n# This file was generated by libcurl! Edit at your own risk.\n"
              ,(FILE *)out);
        local_a8 = h;
        pCVar4 = Curl_llist_head(&h->list);
        while (CVar1 = CURLE_OK, pCVar4 != (Curl_llist_node *)0x0) {
          pvVar5 = Curl_node_elem(pCVar4);
          pCVar4 = Curl_node_next(pCVar4);
          whereto = out;
          if (*(long *)((long)pvVar5 + 0x30) == 0x7fffffffffffffff) {
            pcVar6 = "";
            if (*(char *)((long)pvVar5 + 0x28) != '\0') {
              pcVar6 = ".";
            }
            curl_mfprintf(out,"%s%s \"%s\"\n",pcVar6,*(undefined8 *)((long)pvVar5 + 0x20),
                          "unlimited");
          }
          else {
            CVar1 = Curl_gmtime(*(long *)((long)pvVar5 + 0x30),&local_a0);
            if (CVar1 != CURLE_OK) break;
            pcVar6 = "";
            if (*(char *)((long)pvVar5 + 0x28) != '\0') {
              pcVar6 = ".";
            }
            curl_mfprintf(whereto,"%s%s \"%d%02d%02d %02d:%02d:%02d\"\n",pcVar6,
                          *(undefined8 *)((long)pvVar5 + 0x20),(ulong)(local_a0.tm_year + 0x76c),
                          (ulong)(local_a0.tm_mon + 1),(ulong)(uint)local_a0.tm_mday,
                          (ulong)(uint)local_a0.tm_hour,(ulong)(uint)local_a0.tm_min,
                          (ulong)(uint)local_a0.tm_sec);
          }
        }
        fclose((FILE *)out);
        h = local_a8;
        if (tempstore != (char *)0x0 && CVar1 == CURLE_OK) {
          iVar2 = Curl_rename(tempstore,local_b0);
          CVar1 = CURLE_WRITE_ERROR;
          if (iVar2 == 0) {
            CVar1 = CURLE_OK;
          }
        }
        if (tempstore != (char *)0x0 && CVar1 != CURLE_OK) {
          unlink(tempstore);
        }
      }
      (*Curl_cfree)(tempstore);
    }
    if ((data->set).hsts_write != (curl_hstswrite_callback)0x0) {
      i.total = Curl_llist_count(&h->list);
      i.index = 0;
      pCVar4 = Curl_llist_head(&h->list);
      while (pCVar4 != (Curl_llist_node *)0x0) {
        pvVar5 = Curl_node_elem(pCVar4);
        pCVar4 = Curl_node_next(pCVar4);
        e.name = *(char **)((long)pvVar5 + 0x20);
        e.namelen = strlen(e.name);
        e._16_1_ = *(undefined1 *)((long)pvVar5 + 0x28);
        if (*(long *)((long)pvVar5 + 0x30) == 0x7fffffffffffffff) {
          builtin_strncpy(e.expire,"unlimited",10);
        }
        else {
          CVar1 = Curl_gmtime(*(long *)((long)pvVar5 + 0x30),&local_a0);
          if (CVar1 != CURLE_OK) {
            return CVar1;
          }
          curl_msnprintf(e.expire,0x12,"%d%02d%02d %02d:%02d:%02d",(ulong)(local_a0.tm_year + 0x76c)
                         ,(ulong)(local_a0.tm_mon + 1),(ulong)(uint)local_a0.tm_mday,
                         (ulong)(uint)local_a0.tm_hour,(ulong)(uint)local_a0.tm_min,
                         (ulong)(uint)local_a0.tm_sec);
        }
        CVar3 = (*(data->set).hsts_write)(data,&e,&i,(data->set).hsts_write_userp);
        if (CVar3 == CURLSTS_FAIL) {
          return CURLE_BAD_FUNCTION_ARGUMENT;
        }
        if (CVar3 != CURLSTS_OK) goto LAB_0012fa18;
        i.index = i.index + 1;
        CVar1 = CURLE_OK;
      }
    }
  }
  return CVar1;
}

Assistant:

CURLcode Curl_hsts_save(struct Curl_easy *data, struct hsts *h,
                        const char *file)
{
  struct Curl_llist_node *e;
  struct Curl_llist_node *n;
  CURLcode result = CURLE_OK;
  FILE *out;
  char *tempstore = NULL;

  if(!h)
    /* no cache activated */
    return CURLE_OK;

  /* if no new name is given, use the one we stored from the load */
  if(!file && h->filename)
    file = h->filename;

  if((h->flags & CURLHSTS_READONLYFILE) || !file || !file[0])
    /* marked as read-only, no file or zero length filename */
    goto skipsave;

  result = Curl_fopen(data, file, &out, &tempstore);
  if(!result) {
    fputs("# Your HSTS cache. https://curl.se/docs/hsts.html\n"
          "# This file was generated by libcurl! Edit at your own risk.\n",
          out);
    for(e = Curl_llist_head(&h->list); e; e = n) {
      struct stsentry *sts = Curl_node_elem(e);
      n = Curl_node_next(e);
      result = hsts_out(sts, out);
      if(result)
        break;
    }
    fclose(out);
    if(!result && tempstore && Curl_rename(tempstore, file))
      result = CURLE_WRITE_ERROR;

    if(result && tempstore)
      unlink(tempstore);
  }
  free(tempstore);
skipsave:
  if(data->set.hsts_write) {
    /* if there is a write callback */
    struct curl_index i; /* count */
    i.total = Curl_llist_count(&h->list);
    i.index = 0;
    for(e = Curl_llist_head(&h->list); e; e = n) {
      struct stsentry *sts = Curl_node_elem(e);
      bool stop;
      n = Curl_node_next(e);
      result = hsts_push(data, &i, sts, &stop);
      if(result || stop)
        break;
      i.index++;
    }
  }
  return result;
}